

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O2

void boost::detail::function::
     functor_manager<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/test/impl/unit_test_parameters.ipp:134:24)>
     ::manage(function_buffer *in_buffer,function_buffer *out_buffer,
             functor_manager_operation_type op)

{
  bool bVar1;
  pointer_____offset_0x10___ *local_18;
  
  if (op != get_functor_type_tag) {
    if (op < destroy_functor_tag) {
      return;
    }
    if (op == destroy_functor_tag) {
      return;
    }
    if (op == check_functor_type_tag) {
      local_18 = &unit_test::runtime_config::(anonymous_namespace)::
                  register_parameters(boost::runtime::parameters_store&)::$_0::typeinfo;
      bVar1 = typeindex::operator==
                        (*(type_info **)out_buffer,
                         (type_index_facade<boost::typeindex::stl_type_index,_std::type_info> *)
                         &local_18);
      if (bVar1) {
        *(function_buffer **)out_buffer = in_buffer;
        return;
      }
      *(undefined8 *)out_buffer = 0;
      return;
    }
  }
  *(pointer_____offset_0x10___ **)out_buffer =
       &unit_test::runtime_config::(anonymous_namespace)::
        register_parameters(boost::runtime::parameters_store&)::$_0::typeinfo;
  *(char *)((long)out_buffer + 8) = '\0';
  *(char *)((long)out_buffer + 9) = '\0';
  return;
}

Assistant:

static inline void
        manage(const function_buffer& in_buffer, function_buffer& out_buffer,
               functor_manager_operation_type op)
        {
          typedef typename get_function_tag<functor_type>::type tag_type;
          switch (op) {
          case get_functor_type_tag:
            out_buffer.members.type.type = &boost::typeindex::type_id<functor_type>().type_info();
            out_buffer.members.type.const_qualified = false;
            out_buffer.members.type.volatile_qualified = false;
            return;

          default:
            manager(in_buffer, out_buffer, op, tag_type());
            return;
          }
        }